

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  int iVar2;
  
  iVar2 = pPager->errCode;
  if ((iVar2 == 0) && (iVar2 = 0, pPager->pWal == (Wal *)0x0)) {
    do {
      iVar2 = pagerLockDb(pPager,4);
      if (iVar2 != 5) {
        return iVar2;
      }
      iVar1 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
      iVar2 = 5;
    } while (iVar1 != 0);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = pPager->errCode;
  assert( assert_pager_state(pPager) );
  if( rc==SQLITE_OK ){
    assert( pPager->eState==PAGER_WRITER_CACHEMOD
         || pPager->eState==PAGER_WRITER_DBMOD
         || pPager->eState==PAGER_WRITER_LOCKED
    );
    assert( assert_pager_state(pPager) );
    if( 0==pagerUseWal(pPager) ){
      rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
    }
  }
  return rc;
}